

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O2

void rw::ps2::rasterUnlock(Raster *raster,int32 level)

{
  long lVar1;
  
  lVar1 = (long)nativeRasterOffset;
  if ((raster->format & 0x6000) != 0) {
    swizzleRaster(raster);
  }
  raster->width = raster->originalWidth;
  raster->height = raster->originalHeight;
  raster->pixels = raster->originalPixels;
  raster->stride = raster->originalStride;
  if ((*(byte *)((long)&raster->pixels + lVar1 + 4) & 1) != 0) {
    raster->pixels = (uint8 *)(*(long *)raster->originalPixels + 0x50);
  }
  *(byte *)&raster->privateFlags = (byte)raster->privateFlags & 0xf9;
  return;
}

Assistant:

void
rasterUnlock(Raster *raster, int32 level)
{
	Ps2Raster *natras = GETPS2RASTEREXT(raster);
	if(raster->format & (Raster::PAL4 | Raster::PAL8))
		swizzleRaster(raster);

	raster->width = raster->originalWidth;
	raster->height = raster->originalHeight;
	raster->pixels = raster->originalPixels;
	raster->stride = raster->originalStride;
	if(natras->flags & Ps2Raster::NEWSTYLE)
		raster->pixels = ((Ps2Raster::PixelPtr*)raster->pixels)->pixels + 0x50;

	raster->privateFlags &= ~(Raster::PRIVATELOCK_READ|Raster::PRIVATELOCK_WRITE);
	// TODO: generate mipmaps
}